

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSA.cpp
# Opt level: O0

bool __thiscall OSSLDSA::verifyFinal(OSSLDSA *this,ByteString *signature)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  DSA_SIG *sig_00;
  uchar *puVar6;
  BIGNUM *pBVar7;
  BIGNUM *pBVar8;
  DSA *dsa;
  ulong uVar9;
  ByteString *in_RSI;
  AsymmetricAlgorithm *in_RDI;
  int ret;
  BIGNUM *bn_s;
  BIGNUM *bn_r;
  uchar *s;
  DSA_SIG *sig;
  uint sigLen;
  bool bFirstResult;
  ByteString hash;
  OSSLDSAPublicKey *pk;
  ByteString *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined1 local_48 [40];
  PublicKey *local_20;
  byte local_1;
  
  local_20 = in_RDI->currentPublicKey;
  bVar1 = AsymmetricAlgorithm::verifyFinal(in_RDI,in_RSI);
  if (!bVar1) {
    local_1 = 0;
    goto LAB_00128302;
  }
  ByteString::ByteString((ByteString *)0x127fb3);
  bVar2 = (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 0x20))
                    (in_RDI[1]._vptr_AsymmetricAlgorithm,local_48);
  if (in_RDI[1]._vptr_AsymmetricAlgorithm != (_func_int **)0x0) {
    (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 8))();
  }
  in_RDI[1]._vptr_AsymmetricAlgorithm = (_func_int **)0x0;
  if ((bVar2 & 1) == 0) {
    local_1 = 0;
  }
  else {
    uVar3 = (*(local_20->super_Serialisable)._vptr_Serialisable[5])();
    sVar5 = ByteString::size((ByteString *)0x12808c);
    if (sVar5 == uVar3) {
      sig_00 = DSA_SIG_new();
      if (sig_00 == (DSA_SIG *)0x0) {
        local_1 = 0;
      }
      else {
        puVar6 = ByteString::const_byte_str(in_stack_fffffffffffffee8);
        pBVar7 = BN_bin2bn(puVar6,uVar3 >> 1,(BIGNUM *)0x0);
        pBVar8 = BN_bin2bn(puVar6 + (uVar3 >> 1),uVar3 >> 1,(BIGNUM *)0x0);
        if ((pBVar7 != (BIGNUM *)0x0) && (pBVar8 != (BIGNUM *)0x0)) {
          iVar4 = DSA_SIG_set0(sig_00,pBVar7,pBVar8);
          if (iVar4 != 0) {
            puVar6 = ByteString::operator[]
                               ((ByteString *)
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                (size_t)in_stack_fffffffffffffee8);
            sVar5 = ByteString::size((ByteString *)0x128208);
            iVar4 = (int)sVar5;
            dsa = (DSA *)OSSLDSAPublicKey::getOSSLKey
                                   ((OSSLDSAPublicKey *)CONCAT44(iVar4,in_stack_fffffffffffffef0));
            iVar4 = DSA_do_verify(puVar6,iVar4,sig_00,dsa);
            if (iVar4 == 1) {
              DSA_SIG_free(sig_00);
              local_1 = 1;
            }
            else {
              if (iVar4 < 0) {
                uVar9 = ERR_get_error();
                softHSMLog(3,"verifyFinal",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLDSA.cpp"
                           ,0x1ac,"DSA verify failed (0x%08X)",uVar9);
              }
              DSA_SIG_free(sig_00);
              local_1 = 0;
            }
            goto LAB_001282f5;
          }
        }
        DSA_SIG_free(sig_00);
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
  }
LAB_001282f5:
  ByteString::~ByteString((ByteString *)0x128302);
LAB_00128302:
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLDSA::verifyFinal(const ByteString& signature)
{
	// Save necessary state before calling super class verifyFinal
	OSSLDSAPublicKey* pk = (OSSLDSAPublicKey*) currentPublicKey;

	if (!AsymmetricAlgorithm::verifyFinal(signature))
	{
		return false;
	}

	ByteString hash;

	bool bFirstResult = pCurrentHash->hashFinal(hash);

	delete pCurrentHash;
	pCurrentHash = NULL;

	if (!bFirstResult)
	{
		return false;
	}

	// Perform the verify operation
	unsigned int sigLen = pk->getOutputLength();
	if (signature.size() != sigLen)
		return false;
	DSA_SIG* sig = DSA_SIG_new();
	if (sig == NULL)
		return false;
	const unsigned char *s = signature.const_byte_str();
	BIGNUM* bn_r = BN_bin2bn(s, sigLen / 2, NULL);
	BIGNUM* bn_s = BN_bin2bn(s + sigLen / 2, sigLen / 2, NULL);
	if (bn_r == NULL || bn_s == NULL ||
	    !DSA_SIG_set0(sig, bn_r, bn_s))
	{
		DSA_SIG_free(sig);
		return false;
	}
	int ret = DSA_do_verify(&hash[0], hash.size(), sig, pk->getOSSLKey());
	if (ret != 1)
	{
		if (ret < 0)
			ERROR_MSG("DSA verify failed (0x%08X)", ERR_get_error());

		DSA_SIG_free(sig);
		return false;
	}

	DSA_SIG_free(sig);
	return true;
}